

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O0

void * dsPtr(uint64_t offset,uint64_t length)

{
  dsCrate *crate_00;
  dsCrate *crate;
  uint64_t length_local;
  uint64_t offset_local;
  
  crate_00 = getActiveCrate();
  if (crate_00 == (dsCrate *)0x0) {
    dsRunLogCallback("%s(): Can\'t get active crate.\n","dsPtr");
    offset_local = 0;
  }
  else {
    offset_local = (uint64_t)mapObject(crate_00,offset,length);
  }
  return (void *)offset_local;
}

Assistant:

void *
dsPtr(uint64_t offset, uint64_t length)
{
	dsCrate *crate;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return NULL;
	}

	return mapObject(crate, offset, length);
}